

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O1

_Bool use_context_menu_list_switcher(menu *current_menu,ui_event *in,ui_event *out)

{
  _Bool _Var1;
  char label;
  wchar_t wVar2;
  menu_conflict *m;
  char *label_list;
  ui_event_type uVar3;
  
  if (in->type != EVT_MOUSE) {
    __assert_fail("in->type == EVT_MOUSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-object.c"
                  ,0x439,
                  "_Bool use_context_menu_list_switcher(struct menu *, const ui_event *, ui_event *)"
                 );
  }
  if (((in->mouse).y == '\0') && (m = menu_dynamic_new(), m != (menu_conflict *)0x0)) {
    label_list = string_make("abcdefghijklmnopqrstuvwxyz");
    m->selections = label_list;
    if (((((byte)item_mode & 2) != 0) || (label = '/', allow_all == true)) &&
       (label = '/', player->upkeep->command_wrk != L'\x02')) {
      menu_dynamic_add_label(m,"Inventory",'/',2,label_list);
      label = 'e';
    }
    if (((((byte)item_mode & 1) != 0) || (allow_all == true)) &&
       (player->upkeep->command_wrk != L'\x01')) {
      menu_dynamic_add_label(m,"Equipment",label,1,label_list);
    }
    if (((q1 <= q2) || (allow_all == true)) && (player->upkeep->command_wrk != L'\b')) {
      menu_dynamic_add_label(m,"Quiver",'|',8,label_list);
    }
    if (((f1 <= f2) || (allow_all == true)) && (player->upkeep->command_wrk != L'\x04')) {
      menu_dynamic_add_label(m,"Floor",'-',4,label_list);
    }
    menu_dynamic_add_label(m,"Escape",'q',0,label_list);
    screen_save();
    menu_dynamic_calc_location(m,(uint)(in->mouse).x,(uint)(in->mouse).y);
    region_erase_bordered((region *)&m->boundary);
    wVar2 = menu_dynamic_select(m);
    menu_dynamic_free(m);
    string_free(label_list);
    screen_load();
    _Var1 = true;
    if ((uint)wVar2 < 9) {
      if ((0x116U >> (wVar2 & 0x1fU) & 1) == 0) {
        uVar3 = EVT_ESCAPE;
        if (wVar2 != L'\0') {
          return true;
        }
      }
      else {
        player->upkeep->command_wrk = wVar2;
        newmenu = 1;
        uVar3 = EVT_SWITCH;
      }
      out->type = uVar3;
    }
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool use_context_menu_list_switcher(struct menu *current_menu,
		const ui_event *in, ui_event *out)
{
	struct menu *m;
	char *labels;
	bool allows_inven;
	int selected;

	assert(in->type == EVT_MOUSE);
	if (in->mouse.y != 0) {
		return false;
	}

	m = menu_dynamic_new();
	if (!m) {
		return false;
	}
	labels = string_make(lower_case);

	m->selections = labels;
	if (((item_mode & USE_INVEN) || allow_all)
			&& player->upkeep->command_wrk != USE_INVEN) {
		menu_dynamic_add_label(m, "Inventory", '/', USE_INVEN, labels);
		allows_inven = true;
	} else {
		allows_inven = false;
	}
	if (((item_mode & USE_EQUIP) || allow_all)
			&& player->upkeep->command_wrk != USE_EQUIP) {
		menu_dynamic_add_label(m, "Equipment",
			(allows_inven) ? 'e' : '/', USE_EQUIP, labels);
	}
	if ((q1 <= q2 || allow_all)
			&& player->upkeep->command_wrk != USE_QUIVER) {
		menu_dynamic_add_label(m, "Quiver", '|', USE_QUIVER, labels);
	}
	if ((f1 <= f2 || allow_all)
			&& player->upkeep->command_wrk != USE_FLOOR) {
		menu_dynamic_add_label(m, "Floor", '-', USE_FLOOR, labels);
	}
	menu_dynamic_add_label(m, "Escape", 'q', 0, labels);

	screen_save();

	menu_dynamic_calc_location(m, in->mouse.x, in->mouse.y);
	region_erase_bordered(&m->boundary);

	selected = menu_dynamic_select(m);

	menu_dynamic_free(m);
	string_free(labels);

	screen_load();

	if (selected == USE_INVEN || selected == USE_EQUIP
			|| selected == USE_QUIVER || selected == USE_FLOOR) {
		player->upkeep->command_wrk = selected;
		newmenu = true;
		out->type = EVT_SWITCH;
	} else if (selected == 0) {
		out->type = EVT_ESCAPE;
	}

	return true;
}